

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> __thiscall
fmt::v8::detail::digit_grouping<char32_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
          (digit_grouping<char32_t> *this,
          back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          basic_string_view<char32_t> digits)

{
  long lVar1;
  byte bVar2;
  char32_t cVar3;
  size_t sVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  ulong uVar11;
  undefined **local_828;
  undefined4 *local_820;
  long lStack_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar7 = digits.size_;
  local_820 = local_808;
  local_810 = 500;
  local_828 = &PTR_grow_001b28f0;
  local_808[0] = 0;
  pbVar9 = (byte *)(this->sep_).grouping._M_dataplus._M_p;
  iVar8 = 0;
  lStack_818 = 1;
  do {
    iVar10 = 0x7fffffff;
    if ((this->sep_).thousands_sep != L'\0') {
      pbVar6 = (byte *)((this->sep_).grouping._M_dataplus._M_p +
                       (this->sep_).grouping._M_string_length);
      if (pbVar9 == pbVar6) {
        uVar5 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar2 = *pbVar9;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0016cf22;
        pbVar9 = pbVar9 + 1;
        uVar5 = (uint)bVar2;
      }
      iVar10 = iVar8 + uVar5;
      iVar8 = iVar10;
    }
LAB_0016cf22:
    uVar5 = (uint)digits.size_;
    if (iVar10 >= (int)uVar5 || iVar10 == 0) break;
    if (local_810 < lStack_818 + 1U) {
      (*(code *)*local_828)(&local_828);
    }
    lVar1 = lStack_818 + 1;
    local_820[lStack_818] = iVar10;
    lStack_818 = lVar1;
  } while (iVar10 < (int)uVar5 && iVar10 != 0);
  if (0 < (int)uVar5) {
    iVar8 = (int)lStack_818 + -1;
    uVar11 = 0;
    do {
      if ((int)uVar7 == local_820[iVar8]) {
        cVar3 = (this->sep_).thousands_sep;
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar4 = (out.container)->size_;
        (out.container)->size_ = sVar4 + 1;
        (out.container)->ptr_[sVar4] = cVar3;
        iVar8 = iVar8 + -1;
      }
      cVar3 = digits.data_[uVar11];
      if ((out.container)->capacity_ < (out.container)->size_ + 1) {
        (**(out.container)->_vptr_buffer)(out.container);
      }
      sVar4 = (out.container)->size_;
      (out.container)->size_ = sVar4 + 1;
      (out.container)->ptr_[sVar4] = cVar3;
      uVar11 = uVar11 + 1;
      uVar7 = (ulong)((int)uVar7 - 1);
    } while ((uVar5 & 0x7fffffff) != uVar11);
  }
  if (local_820 != local_808) {
    operator_delete(local_820,local_810 << 2);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }